

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestEthernetV3(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  bool bVar1;
  ulong in_RAX;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  uint i;
  long lVar5;
  uint16_t phyid2;
  ulong uStack_38;
  uint16_t phyid1;
  
  uStack_38 = in_RAX;
  poVar2 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar2 = std::operator<<(poVar2,"=== Ethernet (RTL8211F) Test ===");
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar3 = true;
  for (lVar5 = 1; lVar5 != 3; lVar5 = lVar5 + 1) {
    uStack_38 = uStack_38 & 0xffffffff;
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,(uint)lVar5,1,2,&phyid1);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)logFile,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PHYID1");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,(uint)lVar5,1,3,&phyid2);
    if (!bVar1) {
      poVar2 = std::operator<<((ostream *)logFile,"Failed to read PHY");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," PHYID2");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)logFile,"PHY");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," PHYID = ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,phyid1);
    poVar2 = std::operator<<(poVar2,", ");
    std::ostream::operator<<(poVar2,phyid2);
    pcVar4 = " - FAIL (should be 1c, c916)";
    if (phyid2 == 0xc916 && phyid1 == 0x1c) {
      pcVar4 = " - PASS";
    }
    bVar3 = (bool)(bVar3 & (phyid2 == 0xc916 && phyid1 == 0x1c));
    poVar2 = std::operator<<((ostream *)logFile,pcVar4);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return bVar3;
}

Assistant:

bool TestEthernetV3(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (RTL8211F) Test ===" << std::endl;
    bool ret = true;
    for (unsigned int i = 1; i <= 2; i++) {
        unsigned int phyAddr = FpgaIO::PHY_RTL8211F;
        uint16_t phyid1 = 0, phyid2 = 0;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID1, phyid1))
            logFile << "Failed to read PHY" << i << " PHYID1" << std::endl;
        if (!Board.ReadRTL8211F_Register(i, phyAddr, FpgaIO::RTL8211F_PHYID2, phyid2))
            logFile << "Failed to read PHY" << i << " PHYID2" << std::endl;
        logFile << "PHY" << i << " PHYID = " << std::hex
                << phyid1 << ", " << phyid2;
        if ((phyid1 == 0x001c) && (phyid2 == 0xc916)) {
            logFile << " - PASS" << std::dec << std::endl;
        }
        else {
            logFile << " - FAIL (should be 1c, c916)" << std::dec << std::endl;
            ret = false;
        }
    }
    return ret;
}